

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

FilePath __thiscall testing::internal::FilePath::RemoveDirectoryName(FilePath *this)

{
  char *pcVar1;
  size_t __n;
  char *__dest;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t sVar2;
  String *in_RSI;
  FilePath FVar3;
  String local_38;
  
  pcVar1 = strrchr(in_RSI->c_str_,0x2f);
  if (pcVar1 == (char *)0x0) {
    (this->pathname_).c_str_ = (char *)0x0;
    (this->pathname_).length_ = 0;
    String::operator=(&this->pathname_,in_RSI);
    sVar2 = extraout_RDX_00;
  }
  else {
    __n = strlen(pcVar1 + 1);
    __dest = (char *)operator_new__(__n + 1);
    memcpy(__dest,pcVar1 + 1,__n);
    __dest[__n] = '\0';
    local_38.c_str_ = __dest;
    local_38.length_ = __n;
    FilePath(this,&local_38);
    sVar2 = extraout_RDX;
    if (local_38.c_str_ != (char *)0x0) {
      operator_delete__(local_38.c_str_);
      sVar2 = extraout_RDX_01;
    }
  }
  FVar3.pathname_.length_ = sVar2;
  FVar3.pathname_.c_str_ = (char *)this;
  return (FilePath)FVar3.pathname_;
}

Assistant:

FilePath FilePath::RemoveDirectoryName() const {
  const char* const last_sep = FindLastPathSeparator();
  return last_sep ? FilePath(String(last_sep + 1)) : *this;
}